

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat_pixel.cpp
# Opt level: O0

void ncnn::to_bgr2rgba(Mat *m,uchar *rgba,int stride)

{
  float *pfVar1;
  Mat *this;
  int *piVar2;
  int in_EDX;
  undefined1 *in_RSI;
  long in_RDI;
  int remain;
  int y;
  float *ptr2;
  float *ptr1;
  float *ptr0;
  int wgap;
  int h;
  int w;
  undefined8 in_stack_fffffffffffffec0;
  int _c;
  Mat *in_stack_fffffffffffffec8;
  int local_124 [3];
  int local_118 [3];
  int local_10c [3];
  int local_100;
  int local_fc;
  Mat local_f8;
  float *local_b8;
  Mat local_b0;
  Mat *local_70;
  Mat local_68;
  float *local_28;
  int local_20;
  int local_1c;
  int local_18;
  undefined1 *local_10;
  
  local_18 = *(int *)(in_RDI + 0x2c);
  local_1c = *(int *)(in_RDI + 0x30);
  local_20 = in_EDX + local_18 * -4;
  if (local_20 == 0) {
    local_18 = local_18 * local_1c;
    local_1c = 1;
  }
  local_10 = in_RSI;
  Mat::channel(in_stack_fffffffffffffec8,(int)((ulong)in_stack_fffffffffffffec0 >> 0x20));
  pfVar1 = Mat::operator_cast_to_float_(&local_68);
  Mat::~Mat((Mat *)0x12649d);
  local_28 = pfVar1;
  Mat::channel(in_stack_fffffffffffffec8,(int)((ulong)pfVar1 >> 0x20));
  _c = (int)((ulong)pfVar1 >> 0x20);
  this = (Mat *)Mat::operator_cast_to_float_(&local_b0);
  Mat::~Mat((Mat *)0x1264e3);
  local_70 = this;
  Mat::channel(this,_c);
  pfVar1 = Mat::operator_cast_to_float_(&local_f8);
  Mat::~Mat((Mat *)0x126520);
  local_b8 = pfVar1;
  for (local_fc = 0; local_fc < local_1c; local_fc = local_fc + 1) {
    for (local_100 = local_18; 0 < local_100; local_100 = local_100 + -1) {
      local_10c[2] = (int)*local_b8;
      local_10c[1] = 0;
      piVar2 = std::max<int>(local_10c + 2,local_10c + 1);
      local_10c[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_10c);
      *local_10 = (char)*piVar2;
      local_118[2] = (int)*(float *)&local_70->data;
      local_118[1] = 0;
      piVar2 = std::max<int>(local_118 + 2,local_118 + 1);
      local_118[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_118);
      local_10[1] = (char)*piVar2;
      local_124[2] = (int)*local_28;
      local_124[1] = 0;
      piVar2 = std::max<int>(local_124 + 2,local_124 + 1);
      local_124[0] = 0xff;
      piVar2 = std::min<int>(piVar2,local_124);
      local_10[2] = (char)*piVar2;
      local_10[3] = 0xff;
      local_10 = local_10 + 4;
      local_28 = local_28 + 1;
      local_70 = (Mat *)((long)&local_70->data + 4);
      local_b8 = local_b8 + 1;
    }
    local_10 = local_10 + local_20;
  }
  return;
}

Assistant:

static void to_bgr2rgba(const Mat& m, unsigned char* rgba, int stride)
{
    int w = m.w;
    int h = m.h;

    const int wgap = stride - w * 4;
    if (wgap == 0)
    {
        w = w * h;
        h = 1;
    }

    const float* ptr0 = m.channel(0);
    const float* ptr1 = m.channel(1);
    const float* ptr2 = m.channel(2);

    for (int y=0; y<h; y++)
    {
#define SATURATE_CAST_UCHAR(X) (unsigned char)::std::min(::std::max((int)(X), 0), 255);

        int remain = w;

        for (; remain>0; remain--)
        {
            rgba[0] = SATURATE_CAST_UCHAR(*ptr2);
            rgba[1] = SATURATE_CAST_UCHAR(*ptr1);
            rgba[2] = SATURATE_CAST_UCHAR(*ptr0);
            rgba[3] = 255;

            rgba += 4;
            ptr0++;
            ptr1++;
            ptr2++;
        }

#undef SATURATE_CAST_UCHAR
        rgba += wgap;
    }
}